

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

void __thiscall soplex::SPxScaler<double>::unscale(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  int iVar2;
  Item *pIVar3;
  double *pdVar4;
  Nonzero<double> *pNVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    pdVar4 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar1 = *pdVar4;
    lVar8 = 0;
    do {
      pIVar3 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar2 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar8].idx;
      iVar6 = (lp->super_LPRowSetBase<double>).scaleExp.data[lVar8];
      if (0 < pIVar3[iVar2].data.super_SVectorBase<double>.memused) {
        pIVar3 = pIVar3 + iVar2;
        pNVar5 = (pIVar3->data).super_SVectorBase<double>.m_elem;
        lVar7 = 0;
        lVar9 = 0;
        do {
          dVar10 = ldexp(*(double *)((long)&pNVar5->val + lVar7),
                         -((lp->super_LPColSetBase<double>).scaleExp.data
                           [*(int *)((long)&pNVar5->idx + lVar7)] + iVar6));
          pNVar5 = (pIVar3->data).super_SVectorBase<double>.m_elem;
          *(double *)((long)&pNVar5->val + lVar7) = dVar10;
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar9 < (pIVar3->data).super_SVectorBase<double>.memused);
      }
      iVar6 = -iVar6;
      dVar10 = ldexp((lp->super_LPRowSetBase<double>).object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8],iVar6);
      (lp->super_LPRowSetBase<double>).object.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8] = dVar10;
      dVar10 = (lp->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
      ::soplex::infinity::__tls_init();
      if (dVar10 < dVar1) {
        dVar10 = ldexp((lp->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8],iVar6);
        (lp->super_LPRowSetBase<double>).right.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar8] = dVar10;
      }
      dVar10 = (lp->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
      ::soplex::infinity::__tls_init();
      if (-dVar1 < dVar10) {
        dVar10 = ldexp((lp->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8],iVar6);
        (lp->super_LPRowSetBase<double>).left.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar8] = dVar10;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    pdVar4 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar1 = *pdVar4;
    lVar8 = 0;
    do {
      pIVar3 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar2 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar8].idx;
      iVar6 = (lp->super_LPColSetBase<double>).scaleExp.data[lVar8];
      if (0 < pIVar3[iVar2].data.super_SVectorBase<double>.memused) {
        pIVar3 = pIVar3 + iVar2;
        pNVar5 = (pIVar3->data).super_SVectorBase<double>.m_elem;
        lVar7 = 0;
        lVar9 = 0;
        do {
          dVar10 = ldexp(*(double *)((long)&pNVar5->val + lVar7),
                         -((lp->super_LPRowSetBase<double>).scaleExp.data
                           [*(int *)((long)&pNVar5->idx + lVar7)] + iVar6));
          pNVar5 = (pIVar3->data).super_SVectorBase<double>.m_elem;
          *(double *)((long)&pNVar5->val + lVar7) = dVar10;
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar9 < (pIVar3->data).super_SVectorBase<double>.memused);
      }
      dVar10 = ldexp((lp->super_LPColSetBase<double>).object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8],-iVar6);
      (lp->super_LPColSetBase<double>).object.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8] = dVar10;
      dVar10 = (lp->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
      ::soplex::infinity::__tls_init();
      if (dVar10 < dVar1) {
        dVar10 = ldexp((lp->super_LPColSetBase<double>).up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8],iVar6);
        (lp->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar8] = dVar10;
      }
      dVar10 = (lp->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
      ::soplex::infinity::__tls_init();
      if (-dVar1 < dVar10) {
        dVar10 = ldexp((lp->super_LPColSetBase<double>).low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8],iVar6);
        (lp->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8] = dVar10;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  lp->_isScaled = false;
  return;
}

Assistant:

void SPxScaler<R>::unscale(SPxLPBase<R>& lp)
{
   assert(lp.isScaled());

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);

      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), -exp1 - exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), -exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), -exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), -exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);

      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), -exp1 - exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), -exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), exp2);
   }

   lp._isScaled = false;
   assert(lp.isConsistent());
}